

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool re2::Regexp::Equal(Regexp *a,Regexp *b)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  Regexp **ppRVar4;
  size_type sVar5;
  reference ppRVar6;
  size_t n;
  int local_58;
  int i;
  Regexp *local_48;
  Regexp *b2;
  Regexp *a2;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> stk;
  Regexp *b_local;
  Regexp *a_local;
  
  if ((a == (Regexp *)0x0) || (b == (Regexp *)0x0)) {
    a_local._7_1_ = a == b;
  }
  else {
    stk.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)b;
    bVar1 = TopEqual(a,b);
    if (bVar1) {
      RVar2 = op(a);
      if (RVar2 - kRegexpConcat < 7) {
        std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::vector
                  ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&a2);
        b_local = a;
LAB_0012b407:
        do {
          RVar2 = op(b_local);
          if (RVar2 - kRegexpConcat < 2) {
            for (local_58 = 0; iVar3 = nsub(b_local), local_58 < iVar3; local_58 = local_58 + 1) {
              ppRVar4 = sub(b_local);
              b2 = ppRVar4[local_58];
              ppRVar4 = sub((Regexp *)
                            stk.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
              local_48 = ppRVar4[local_58];
              bVar1 = TopEqual(b2,local_48);
              if (!bVar1) {
                a_local._7_1_ = false;
                goto LAB_0012b640;
              }
              std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::push_back
                        ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&a2,&b2);
              std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::push_back
                        ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&a2,&local_48);
            }
          }
          else if (RVar2 - kRegexpStar < 5) {
            ppRVar4 = sub(b_local);
            b2 = *ppRVar4;
            ppRVar4 = sub((Regexp *)
                          stk.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            local_48 = *ppRVar4;
            bVar1 = TopEqual(b2,local_48);
            if (!bVar1) {
              a_local._7_1_ = false;
              goto LAB_0012b640;
            }
            b_local = b2;
            stk.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_48;
            goto LAB_0012b407;
          }
          sVar5 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::size
                            ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&a2);
          if (sVar5 == 0) {
            a_local._7_1_ = true;
LAB_0012b640:
            std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::~vector
                      ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&a2);
            return a_local._7_1_;
          }
          if (sVar5 < 2) {
            __assert_fail("(n) >= (2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc"
                          ,0x1c9,"static bool re2::Regexp::Equal(Regexp *, Regexp *)");
          }
          ppRVar6 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::operator[]
                              ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&a2,
                               sVar5 - 2);
          b_local = *ppRVar6;
          ppRVar6 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::operator[]
                              ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&a2,
                               sVar5 - 1);
          stk.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*ppRVar6;
          std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::resize
                    ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&a2,sVar5 - 2);
        } while( true );
      }
      a_local._7_1_ = true;
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

bool Regexp::Equal(Regexp* a, Regexp* b) {
  if (a == NULL || b == NULL)
    return a == b;

  if (!TopEqual(a, b))
    return false;

  // Fast path:
  // return without allocating vector if there are no subregexps.
  switch (a->op()) {
    case kRegexpAlternate:
    case kRegexpConcat:
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
    case kRegexpRepeat:
    case kRegexpCapture:
      break;

    default:
      return true;
  }

  // Committed to doing real work.
  // The stack (vector) has pairs of regexps waiting to
  // be compared.  The regexps are only equal if
  // all the pairs end up being equal.
  vector<Regexp*> stk;

  for (;;) {
    // Invariant: TopEqual(a, b) == true.
    Regexp* a2;
    Regexp* b2;
    switch (a->op()) {
      default:
        break;
      case kRegexpAlternate:
      case kRegexpConcat:
        for (int i = 0; i < a->nsub(); i++) {
          a2 = a->sub()[i];
          b2 = b->sub()[i];
          if (!TopEqual(a2, b2))
            return false;
          stk.push_back(a2);
          stk.push_back(b2);
        }
        break;

      case kRegexpStar:
      case kRegexpPlus:
      case kRegexpQuest:
      case kRegexpRepeat:
      case kRegexpCapture:
        a2 = a->sub()[0];
        b2 = b->sub()[0];
        if (!TopEqual(a2, b2))
          return false;
        // Really:
        //   stk.push_back(a2);
        //   stk.push_back(b2);
        //   break;
        // but faster to assign directly and loop.
        a = a2;
        b = b2;
        continue;
    }

    size_t n = stk.size();
    if (n == 0)
      break;

    DCHECK_GE(n, 2);
    a = stk[n-2];
    b = stk[n-1];
    stk.resize(n-2);
  }

  return true;
}